

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O3

ssize_t tnt_io_recv_raw(tnt_stream_net *s,char *buf,size_t size,int all)

{
  tnt_iob_tx_t p_Var1;
  long lVar2;
  int *piVar3;
  size_t sVar4;
  
  sVar4 = 0;
  while( true ) {
    p_Var1 = (s->rbuf).tx;
    if (p_Var1 == (tnt_iob_tx_t)0x0) {
      while (lVar2 = recv(s->fd,buf + sVar4,size - sVar4,0), lVar2 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) goto LAB_001087fe;
      }
    }
    else {
      lVar2 = (*p_Var1)(&s->rbuf,buf + sVar4,size - sVar4);
    }
    if (lVar2 < 1) break;
    sVar4 = sVar4 + lVar2;
    if (all == 0) {
      return sVar4;
    }
    if (sVar4 == size) {
      return sVar4;
    }
  }
  piVar3 = __errno_location();
LAB_001087fe:
  s->error = TNT_ESYSTEM;
  s->errno_ = *piVar3;
  return -1;
}

Assistant:

ssize_t
tnt_io_recv_raw(struct tnt_stream_net *s, char *buf, size_t size, int all)
{
	size_t off = 0;
	do {
		ssize_t r;
		if (s->rbuf.tx) {
			r = s->rbuf.tx(&s->rbuf, buf + off, size - off);
		} else {
			do {
				r = recv(s->fd, buf + off, size - off, 0);
			} while (r == -1 && (errno == EINTR));
		}
		if (r <= 0) {
			s->error = TNT_ESYSTEM;
			s->errno_ = errno;
			return -1;
		}
		off += r;
	} while (off != size && all);
	return off;
}